

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O1

void ProcessGestureEvent(GestureEvent event)

{
  Vector2 VVar1;
  Vector2 VVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar14;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  timespec now;
  int in_stack_00000010;
  Vector2 in_stack_00000020;
  Vector2 in_stack_00000028;
  timespec local_28;
  float local_14;
  
  GESTURES.Touch.pointCount = now.tv_nsec._4_4_;
  fVar4 = in_stack_00000020.x;
  fVar14 = in_stack_00000020.y;
  if (now.tv_nsec._4_4_ < 2) {
    if ((int)now.tv_nsec == 0) {
      if (GESTURES.current == 8) {
        GESTURES.Touch.upPosition = in_stack_00000020;
      }
      fVar4 = GESTURES.Touch.downPositionA.x - GESTURES.Touch.upPosition.x;
      fVar14 = GESTURES.Touch.downPositionA.y - GESTURES.Touch.upPosition.y;
      local_14 = fVar4 * fVar4 + fVar14 * fVar14;
      if (local_14 < 0.0) {
        local_14 = sqrtf(local_14);
      }
      else {
        local_14 = SQRT(local_14);
      }
      GESTURES.Drag.distance = local_14;
      clock_gettime(1,&local_28);
      local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      auVar10._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
      auVar10._0_8_ = local_28.tv_nsec;
      auVar10._12_4_ = 0x45300000;
      GESTURES.Drag.intensity =
           local_14 /
           (float)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) /
                   1000000.0 - GESTURES.Swipe.timeDuration);
      GESTURES.Swipe.start = false;
      if ((GESTURES.Drag.intensity <= 0.0005) || (GESTURES.Touch.firstId != in_stack_00000010)) {
        GESTURES.Drag.intensity = 0.0;
        GESTURES.Drag.angle = 0.0;
        GESTURES.Drag.distance = 0.0;
        GESTURES.current = 0;
      }
      else {
        fVar4 = atan2f(GESTURES.Touch.upPosition.y - GESTURES.Touch.downPositionA.y,
                       GESTURES.Touch.upPosition.x - GESTURES.Touch.downPositionA.x);
        fVar4 = fVar4 * 57.295776;
        GESTURES.Drag.angle =
             360.0 - (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                            (uint)(fVar4 + 360.0) & -(uint)(fVar4 < 0.0));
        GESTURES.current = 0x10;
        if ((((30.0 <= GESTURES.Drag.angle) && (GESTURES.Drag.angle <= 330.0)) &&
            ((GESTURES.Drag.angle <= 30.0 || (GESTURES.current = 0x40, 120.0 <= GESTURES.Drag.angle)
             ))) && ((GESTURES.Drag.angle <= 120.0 ||
                     (GESTURES.current = 0x20, 210.0 <= GESTURES.Drag.angle)))) {
          GESTURES.current =
               (-(uint)(GESTURES.Drag.angle < 300.0 && 210.0 < GESTURES.Drag.angle) & 1) << 7;
        }
      }
      GESTURES.Touch.pointCount = 0;
      GESTURES.Touch.downDragPosition.x = 0.0;
      GESTURES.Touch.downDragPosition.y = 0.0;
      return;
    }
    if ((int)now.tv_nsec == 2) {
      if (GESTURES.current == 8) {
        clock_gettime(1,&local_28);
        lVar3 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
        auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar8._0_8_ = lVar3;
        auVar8._12_4_ = 0x45300000;
        GESTURES.Touch.eventTime =
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0;
      }
      if (GESTURES.Swipe.start == false) {
        clock_gettime(1,&local_28);
        lVar3 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
        auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar9._0_8_ = lVar3;
        auVar9._12_4_ = 0x45300000;
        GESTURES.Swipe.timeDuration =
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0;
        GESTURES.Swipe.start = true;
      }
      GESTURES.Touch.moveDownPositionA = in_stack_00000020;
      if (GESTURES.current == 4) {
        if (GESTURES.Hold.resetRequired == true) {
          GESTURES.Touch.downPositionA = in_stack_00000020;
        }
        GESTURES.Hold.resetRequired = false;
        fVar4 = GESTURES.Touch.downPositionA.x - fVar4;
        fVar14 = GESTURES.Touch.downPositionA.y - fVar14;
        fVar4 = fVar4 * fVar4 + fVar14 * fVar14;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        if (0.015 <= fVar4) {
          clock_gettime(1,&local_28);
          local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
          auVar11._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
          auVar11._0_8_ = local_28.tv_nsec;
          auVar11._12_4_ = 0x45300000;
          GESTURES.Touch.eventTime =
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) /
               1000000.0;
          GESTURES.current = 8;
        }
      }
      GESTURES.Drag.vector.y =
           GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
      GESTURES.Drag.vector.x =
           GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
      return;
    }
    if ((int)now.tv_nsec != 1) {
      return;
    }
    if (0 < GESTURES.Touch.tapCounter && GESTURES.current == 0) {
      GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1;
      clock_gettime(1,&local_28);
      lVar3 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      if (((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0 -
          GESTURES.Touch.eventTime < 300.0) {
        fVar4 = GESTURES.Touch.downPositionA.x - fVar4;
        fVar14 = GESTURES.Touch.downPositionA.y - fVar14;
        fVar4 = fVar4 * fVar4 + fVar14 * fVar14;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        if (fVar4 < 0.03) {
          GESTURES.current = 2;
          GESTURES.Touch.tapCounter = 0;
          goto LAB_0011d84d;
        }
      }
    }
    GESTURES.Touch.tapCounter = 1;
    GESTURES.current = 1;
LAB_0011d84d:
    GESTURES.Touch.downPositionA = in_stack_00000020;
    GESTURES.Touch.downDragPosition = in_stack_00000020;
    GESTURES.Touch.upPosition = in_stack_00000020;
    clock_gettime(1,&local_28);
    local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    auVar13._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
    auVar13._0_8_ = local_28.tv_nsec;
    auVar13._12_4_ = 0x45300000;
    GESTURES.Touch.firstId = in_stack_00000010;
    GESTURES.Touch.eventTime =
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
    GESTURES.Drag.vector.x = 0.0;
    GESTURES.Drag.vector.y = 0.0;
    return;
  }
  if ((int)now.tv_nsec == 0) {
    GESTURES.current = 0;
    GESTURES.Touch.pointCount = 0;
    GESTURES.Pinch = (anon_struct_16_3_87c46a66_for_Pinch)ZEXT816(0);
    return;
  }
  if ((int)now.tv_nsec != 2) {
    if ((int)now.tv_nsec != 1) {
      return;
    }
    GESTURES.Touch.downPositionA = in_stack_00000020;
    GESTURES.Touch.downPositionB = in_stack_00000028;
    VVar1 = GESTURES.Touch.downPositionB;
    GESTURES.Touch.downPositionB.x = in_stack_00000028.x;
    GESTURES.Touch.downPositionB.y = in_stack_00000028.y;
    GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - fVar14;
    GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - fVar4;
    GESTURES.current = 4;
    GESTURES.Touch.downPositionB = VVar1;
    clock_gettime(1,&local_28);
    local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    auVar7._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
    auVar7._0_8_ = local_28.tv_nsec;
    auVar7._12_4_ = 0x45300000;
    GESTURES.Hold.timeDuration =
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
    return;
  }
  fVar5 = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.moveDownPositionB.x;
  fVar15 = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.moveDownPositionB.y;
  fVar5 = fVar5 * fVar5 + fVar15 * fVar15;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  VVar1 = GESTURES.Touch.moveDownPositionA;
  GESTURES.Pinch.distance = fVar5;
  GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
  GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;
  GESTURES.Touch.moveDownPositionA = in_stack_00000020;
  GESTURES.Touch.moveDownPositionB = in_stack_00000028;
  VVar2 = GESTURES.Touch.moveDownPositionB;
  GESTURES.Touch.moveDownPositionB.x = in_stack_00000028.x;
  GESTURES.Touch.moveDownPositionB.y = in_stack_00000028.y;
  GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - fVar14;
  GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - fVar4;
  fVar4 = VVar1.x - fVar4;
  fVar14 = VVar1.y - fVar14;
  fVar4 = fVar4 * fVar4 + fVar14 * fVar14;
  GESTURES.Touch.moveDownPositionB = VVar2;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if (fVar4 < 0.005) {
    fVar4 = GESTURES.Touch.downPositionB.x - GESTURES.Touch.moveDownPositionB.x;
    fVar14 = GESTURES.Touch.downPositionB.y - GESTURES.Touch.moveDownPositionB.y;
    fVar4 = fVar4 * fVar4 + fVar14 * fVar14;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    if (fVar4 < 0.005) {
      GESTURES.current = 4;
      clock_gettime(1,&local_28);
      local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      auVar12._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
      auVar12._0_8_ = local_28.tv_nsec;
      auVar12._12_4_ = 0x45300000;
      GESTURES.Hold.timeDuration =
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
      goto LAB_0011d7b9;
    }
  }
  fVar4 = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.moveDownPositionB.x;
  fVar14 = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.moveDownPositionB.y;
  fVar4 = fVar4 * fVar4 + fVar14 * fVar14;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if (GESTURES.Pinch.distance <= fVar4) {
    GESTURES.current = 0x200;
  }
  else {
    GESTURES.current = 0x100;
  }
LAB_0011d7b9:
  fVar4 = atan2f(GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y,
                 GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x);
  fVar4 = fVar4 * 57.295776;
  GESTURES.Pinch.angle =
       360.0 - (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                      (uint)(fVar4 + 360.0) & -(uint)(fVar4 < 0.0));
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount < 2)
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((GetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (Vector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = GetCurrentTime();

            GESTURES.Touch.firstId = event.pointerId[0];

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_UP)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependend on the resolution of the screen
            GESTURES.Drag.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((GetCurrentTime() - GESTURES.Swipe.timeDuration));

            GESTURES.Swipe.start = false;

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.Touch.firstId == event.pointerId[0]))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - Vector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;        // Right
                else if ((GESTURES.Drag.angle > 30) && (GESTURES.Drag.angle < 120)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 120) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;   // Left
                else if ((GESTURES.Drag.angle > 210) && (GESTURES.Drag.angle < 300)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.eventTime = GetCurrentTime();

            if (!GESTURES.Swipe.start)
            {
                GESTURES.Swipe.timeDuration = GetCurrentTime();
                GESTURES.Swipe.start = true;
            }

            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if (Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_DRAG)
                {
                    GESTURES.Touch.eventTime = GetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else    // Two touch points
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            //GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = GetCurrentTime();
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
            GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (Vector2Distance(GESTURES.Touch.downPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ((Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) - GESTURES.Pinch.distance) < 0) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = GetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - Vector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
}